

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::IsinfCase::getInputValues(IsinfCase *this,int numValues,void **values)

{
  char cVar1;
  Precision PVar2;
  pointer pSVar3;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  Random rnd;
  deRandom local_40;
  
  dVar5 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar5 ^ 0xc2a39f);
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  iVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  cVar1 = (&DAT_01c9ed3c)[(ulong)PVar2 * 4];
  if (0 < iVar6 * numValues) {
    uVar8 = 0;
    do {
      fVar10 = deRandom_getFloat(&local_40);
      uVar7 = 0;
      bVar4 = false;
      if (fVar10 <= 0.3) {
        fVar11 = deRandom_getFloat(&local_40);
        bVar4 = 0.4 < fVar11;
        dVar5 = deRandom_getUint32(&local_40);
        uVar7 = dVar5 & (0x3fffffU >> (0x17U - cVar1 & 0x1f)) << (0x17U - cVar1 & 0x1f) | 0x400000;
      }
      uVar9 = 0x7f800000;
      if (!(bool)(0.3 < fVar10 | bVar4)) {
        dVar5 = deRandom_getUint32(&local_40);
        uVar9 = (dVar5 & 0x7f) << 0x17;
      }
      dVar5 = deRandom_getUint32(&local_40);
      *(deUint32 *)((long)*values + uVar8 * 4) = dVar5 << 0x1f | uVar9 | uVar7;
      uVar8 = uVar8 + 1;
    } while ((uint)(iVar6 * numValues) != uVar8);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(getName()) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isInf		= rnd.getFloat() > 0.3f;
			const bool		isNan		= !isInf && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}